

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloter_interface.h
# Opt level: O2

Event * __thiscall cppnet::AlloterWrap::PoolNew<cppnet::Event>(AlloterWrap *this)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  Event *pEVar3;
  
  peVar1 = (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar2 = (*peVar1->_vptr_Alloter[3])(peVar1,0x28);
  pEVar3 = (Event *)CONCAT44(extraout_var,iVar2);
  if (pEVar3 != (Event *)0x0) {
    pEVar3->_vptr_Event = (_func_int **)&PTR__Event_00127160;
    pEVar3->_data = (void *)0x0;
    pEVar3->_event_type = 0;
    (pEVar3->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pEVar3->_socket).super___weak_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  return pEVar3;
}

Assistant:

T* AlloterWrap::PoolNew(Args&&... args) {
    uint32_t sz = sizeof(T);
    
    void* data = _alloter->MallocAlign(sz);
    if (!data) {
        return nullptr;
    }

    T* res = new(data) T(std::forward<Args>(args)...);
    return res;
}